

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O1

int __thiscall MatroskaDemuxer::ebml_read_element_level_up(MatroskaDemuxer *this)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = this->num_levels;
  lVar1 = (this->super_IOContextDemuxer).m_processedBytes;
  iVar2 = 0;
  while ((0 < (int)uVar3 &&
         (uVar3 = uVar3 - 1, this->levels[uVar3].length + this->levels[uVar3].start <= lVar1))) {
    this->num_levels = uVar3;
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int MatroskaDemuxer::ebml_read_element_level_up()
{
    // offset_t pos = url_ftell(pb);
    int num = 0;

    while (num_levels > 0)
    {
        const MatroskaLevel *level = &levels[num_levels - 1];

        if (m_processedBytes >= level->start + level->length)
        {
            num_levels--;
            num++;
        }
        else
        {
            break;
        }
    }

    return num;
}